

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  byte bVar2;
  CppType CVar3;
  Type TVar4;
  Syntax SVar5;
  FileDescriptor *this_00;
  FieldDescriptor *in_RCX;
  FieldDescriptor *in_RDX;
  bool in_stack_00000037;
  FieldDescriptor *in_stack_00000038;
  char *in_stack_00000040;
  Printer *in_stack_00000048;
  Generator *in_stack_00000050;
  bool use_default;
  string value_to_object;
  FieldDescriptor *value_field;
  FieldDescriptor *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  FieldDescriptor *in_stack_fffffffffffffe40;
  GeneratorOptions *options_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  Printer *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  bool drop_list;
  BytesMode in_stack_fffffffffffffe9c;
  Printer *in_stack_fffffffffffffea0;
  GeneratorOptions *in_stack_fffffffffffffea8;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  FieldDescriptor *local_58;
  undefined1 local_40 [64];
  
  options_00 = (GeneratorOptions *)local_40;
  local_40._32_8_ = in_RCX;
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_(options_00,in_RDX);
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
             (char (*) [10])CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             &options_00->output_dir);
  std::__cxx11::string::~string((string *)local_40);
  bVar1 = FieldDescriptor::is_map(in_stack_fffffffffffffe30);
  if (bVar1) {
    local_58 = anon_unknown_0::MapFieldValue((FieldDescriptor *)0x4694c2);
    std::__cxx11::string::string(local_78);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4694e4);
    if (CVar3 == CPPTYPE_MESSAGE) {
      FieldDescriptor::message_type(in_stack_fffffffffffffe30);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_(options_00,(Descriptor *)in_RDX);
      std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
      std::__cxx11::string::operator=(local_78,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      std::__cxx11::string::operator=(local_78,"undefined");
    }
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (in_stack_fffffffffffffea8,(FieldDescriptor *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe9c,SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
    io::Printer::Print<char[5],std::__cxx11::string,char[14],std::__cxx11::string>
              (in_stack_fffffffffffffea0,
               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               &in_stack_fffffffffffffe90->variable_delimiter_,in_stack_fffffffffffffe88,
               (char (*) [14])CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               &options_00->output_dir);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_78);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4696bf);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4696d5);
      drop_list = SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0);
      if (bVar1) {
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (in_stack_fffffffffffffea8,(FieldDescriptor *)in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9c,drop_list);
        (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                  (in_stack_fffffffffffffea8,(FieldDescriptor *)in_stack_fffffffffffffea0);
        io::Printer::Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string>
                  (in_stack_fffffffffffffea0,
                   (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   &in_stack_fffffffffffffe90->variable_delimiter_,in_stack_fffffffffffffe88,
                   (char (*) [5])CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   &options_00->output_dir);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string(local_f8);
      }
      else {
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (in_stack_fffffffffffffea8,(FieldDescriptor *)in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9c,drop_list);
        (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                  (in_stack_fffffffffffffea8,(FieldDescriptor *)in_stack_fffffffffffffea0);
        io::Printer::Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string>
                  (in_stack_fffffffffffffea0,
                   (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   &in_stack_fffffffffffffe90->variable_delimiter_,in_stack_fffffffffffffe88,
                   (char (*) [5])CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   &options_00->output_dir);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
        std::__cxx11::string::~string(local_138);
      }
    }
    else {
      TVar4 = FieldDescriptor::type(in_stack_fffffffffffffe40);
      if (TVar4 == TYPE_BYTES) {
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (in_stack_fffffffffffffea8,(FieldDescriptor *)in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9c,SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
        io::Printer::Print<char[7],std::__cxx11::string>
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (char (*) [7])CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   &options_00->output_dir);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
      }
      else {
        bVar2 = FieldDescriptor::has_default_value((FieldDescriptor *)local_40._32_8_);
        this_00 = FieldDescriptor::file((FieldDescriptor *)local_40._32_8_);
        SVar5 = FileDescriptor::syntax(this_00);
        if ((SVar5 == SYNTAX_PROTO3) &&
           (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x469983), !bVar1)) {
          bVar2 = 1;
        }
        if ((bVar2 & 1) == 0) {
          io::Printer::Print<>
                    ((Printer *)CONCAT17(bVar2,in_stack_fffffffffffffe80),(char *)options_00);
        }
        GenerateFieldValueExpression
                  (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                   in_stack_00000037);
        if ((bVar2 & 1) == 0) {
          io::Printer::Print<>
                    ((Printer *)CONCAT17(bVar2,in_stack_fffffffffffffe80),(char *)options_00);
        }
      }
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldToObject(const GeneratorOptions& options,
                                           io::Printer* printer,
                                           const FieldDescriptor* field) const {
  printer->Print("$fieldname$: ", "fieldname",
                 JSObjectFieldName(options, field));

  if (field->is_map()) {
    const FieldDescriptor* value_field = MapFieldValue(field);
    // If the map values are of a message type, we must provide their static
    // toObject() method; otherwise we pass undefined for that argument.
    std::string value_to_object;
    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      value_to_object =
          GetMessagePath(options, value_field->message_type()) + ".toObject";
    } else {
      value_to_object = "undefined";
    }
    printer->Print(
        "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) "
        ": []",
        "name", JSGetterName(options, field), "valuetoobject", value_to_object);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field.
    if (field->is_repeated()) {
      {
        printer->Print(
            "jspb.Message.toObjectList(msg.get$getter$(),\n"
            "    $type$.toObject, includeInstance)",
            "getter", JSGetterName(options, field), "type",
            SubmessageTypeRef(options, field));
      }
    } else {
      printer->Print(
          "(f = msg.get$getter$()) && "
          "$type$.toObject(includeInstance, f)",
          "getter", JSGetterName(options, field), "type",
          SubmessageTypeRef(options, field));
    }
  } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
    // For bytes fields we want to always return the B64 data.
    printer->Print("msg.get$getter$()", "getter",
                   JSGetterName(options, field, BYTES_B64));
  } else {
    bool use_default = field->has_default_value();

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        // Repeated fields get initialized to their default in the constructor
        // (why?), so we emit a plain getField() call for them.
        !field->is_repeated()) {
      // Proto3 puts all defaults (including implicit defaults) in toObject().
      // But for proto2 we leave the existing semantics unchanged: unset fields
      // without default are unset.
      use_default = true;
    }

    // We don't implement this by calling the accessors, because the semantics
    // of the accessors are changing independently of the toObject() semantics.
    // We are migrating the accessors to return defaults instead of null, but
    // it may take longer to migrate toObject (or we might not want to do it at
    // all).  So we want to generate independent code.
    // The accessor for unset optional values without default should return
    // null. Those are converted to undefined in the generated object.
    if (!use_default) {
      printer->Print("(f = ");
    }
    GenerateFieldValueExpression(printer, "msg", field, use_default);
    if (!use_default) {
      printer->Print(") == null ? undefined : f");
    }
  }
}